

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgImplementPerm(Abc_TgMan_t *pMan,char *pPermDest)

{
  int nVars_00;
  char *pCanonPerm;
  uint local_34;
  uint uPhase;
  char *pRev;
  char *pPerm;
  int nVars;
  int i;
  char *pPermDest_local;
  Abc_TgMan_t *pMan_local;
  
  nVars_00 = pMan->nVars;
  pCanonPerm = pMan->pPermTRev;
  local_34 = pMan->uPhase & 1 << ((byte)nVars_00 & 0x1f);
  for (pPerm._4_4_ = 0; pPerm._4_4_ < nVars_00; pPerm._4_4_ = pPerm._4_4_ + 1) {
    pCanonPerm[(int)pMan->pPermT[pPerm._4_4_]] = (char)pPerm._4_4_;
  }
  for (pPerm._4_4_ = 0; pPerm._4_4_ < nVars_00; pPerm._4_4_ = pPerm._4_4_ + 1) {
    pMan->pPermT[pPerm._4_4_] = pCanonPerm[(int)pPermDest[pPerm._4_4_]];
  }
  for (pPerm._4_4_ = 0; pPerm._4_4_ < nVars_00; pPerm._4_4_ = pPerm._4_4_ + 1) {
    pCanonPerm[(int)pMan->pPermT[pPerm._4_4_]] = (char)pPerm._4_4_;
  }
  Abc_TtImplementNpnConfig(pMan->pTruth,nVars_00,pCanonPerm,0);
  for (pPerm._4_4_ = 0; pPerm._4_4_ < nVars_00; pPerm._4_4_ = pPerm._4_4_ + 1) {
    if ((pMan->uPhase & 1 << (pMan->pPermT[pPerm._4_4_] & 0x1fU)) != 0) {
      local_34 = 1 << ((byte)pPerm._4_4_ & 0x1f) | local_34;
    }
    pMan->pPermT[pPerm._4_4_] = pPermDest[pPerm._4_4_];
    pCanonPerm[(int)pMan->pPermT[pPerm._4_4_]] = (byte)pPerm._4_4_;
  }
  pMan->uPhase = local_34;
  return;
}

Assistant:

static void Abc_TgImplementPerm(Abc_TgMan_t* pMan, const char *pPermDest)
{
    int i, nVars = pMan->nVars;
    char *pPerm = pMan->pPermT;
    char *pRev = pMan->pPermTRev;
    unsigned uPhase = pMan->uPhase & (1 << nVars);

    for (i = 0; i < nVars; i++)
        pRev[(int)pPerm[i]] = i;
    for (i = 0; i < nVars; i++)
        pPerm[i] = pRev[(int)pPermDest[i]];
    for (i = 0; i < nVars; i++)
        pRev[(int)pPerm[i]] = i;

    Abc_TtImplementNpnConfig(pMan->pTruth, nVars, pRev, 0);
//  Abc_TtVerifySmallTruth(pMan->pTruth, nVars);

    for (i = 0; i < nVars; i++)
    {
        if (pMan->uPhase & (1 << pPerm[i]))
            uPhase |= (1 << i);
        pPerm[i] = pPermDest[i];
        pRev[(int)pPerm[i]] = i;
    }
    pMan->uPhase = uPhase;
}